

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

bool WScriptJsrt::Uninitialize(void)

{
  void **__args;
  long lVar1;
  _List_node_base *p_Var2;
  code *pcVar3;
  size_t sVar4;
  DWORD DVar5;
  RuntimeThreadLocalData *pRVar6;
  PAL_FILE *pPVar7;
  _List_node_base *p_Var8;
  RuntimeThreadData *pRVar9;
  list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_> *plVar10;
  HANDLE *ppVStack_48;
  vector<void_*,_std::allocator<void_*>_> childrenHandles;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::clear(&moduleRecordMap_abi_cxx11_._M_t);
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&moduleDirMap_abi_cxx11_._M_t);
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_ModuleState>,_std::_Select1st<std::pair<void_*const,_ModuleState>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
  ::clear(&moduleErrMap._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&scriptDirMap_abi_cxx11_._M_t);
  pRVar6 = GetRuntimeThreadLocalData();
  pRVar9 = pRVar6->threadData;
  if ((pRVar9 != (RuntimeThreadData *)0x0) &&
     ((pRVar9->children).super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&pRVar9->children)) {
    sVar4 = (pRVar9->children).
            super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>._M_impl.
            _M_node._M_size;
    ppVStack_48 = (HANDLE *)0x0;
    childrenHandles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    childrenHandles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var8 = (_List_node_base *)&pRVar6->threadData->children;
    while (p_Var8 = (((_List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_> *)
                     &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var8 != (_List_node_base *)&pRVar6->threadData->children) {
      lVar1 = (long)p_Var8[1]._M_next;
      __args = (void **)(lVar1 + 0x20);
      if (childrenHandles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          childrenHandles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  ((vector<void*,std::allocator<void*>> *)&ppVStack_48,
                   (iterator)
                   childrenHandles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start,__args);
      }
      else {
        *childrenHandles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_start = *__args;
        childrenHandles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             childrenHandles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      SetEvent(*(HANDLE *)(lVar1 + 0x10));
    }
    DVar5 = WaitForMultipleObjects((DWORD)sVar4,ppVStack_48,1,0xffffffff);
    if (DVar5 != 0) {
      pPVar7 = PAL_get_stderr(0);
      PAL_fprintf(pPVar7,"ASSERTION (%s, line %d) %s %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/WScriptJsrt.cpp"
                  ,0x4fd,"waitRet == 0","waitRet == WAIT_OBJECT_0");
      pPVar7 = PAL_get_stderr(0);
      PAL_fflush(pPVar7);
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    pRVar9 = pRVar6->threadData;
    for (p_Var8 = (pRVar9->children).
                  super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next; plVar10 = &pRVar9->children,
        p_Var8 != (_List_node_base *)plVar10; p_Var8 = p_Var8->_M_next) {
      pRVar9 = (RuntimeThreadData *)p_Var8[1]._M_next;
      if (pRVar9 != (RuntimeThreadData *)0x0) {
        RuntimeThreadData::~RuntimeThreadData(pRVar9);
        operator_delete(pRVar9);
      }
      pRVar9 = pRVar6->threadData;
    }
    p_Var8 = (pRVar9->children).
             super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    while (p_Var8 != (_List_node_base *)plVar10) {
      p_Var2 = p_Var8->_M_next;
      operator_delete(p_Var8);
      p_Var8 = p_Var2;
    }
    (pRVar9->children).super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar10;
    (plVar10->super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>)._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)plVar10;
    (pRVar9->children).super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>.
    _M_impl._M_node._M_size = 0;
    if (ppVStack_48 != (HANDLE *)0x0) {
      operator_delete(ppVStack_48);
    }
  }
  return true;
}

Assistant:

bool WScriptJsrt::Uninitialize()
{
    // moduleRecordMap is a global std::map, its destructor may access overridden
    // "operator delete" / global HeapAllocator::Instance. Clear it manually here
    // to avoid worrying about global destructor order.
    moduleRecordMap.clear();
    moduleDirMap.clear();
    moduleErrMap.clear();
    scriptDirMap.clear();

    auto& threadData = GetRuntimeThreadLocalData().threadData;
    if (threadData && !threadData->children.empty())
    {
        LONG count = (LONG)threadData->children.size();
        std::vector<HANDLE> childrenHandles;

        //Clang does not support "for each" yet
        for(auto i = threadData->children.begin(); i!= threadData->children.end(); i++)
        {
            auto child = *i;
            childrenHandles.push_back(child->hThread);
            SetEvent(child->hevntShutdown);
        }

        DWORD waitRet = WaitForMultipleObjects(count, &childrenHandles[0], TRUE, INFINITE);
        Assert(waitRet == WAIT_OBJECT_0);

        for (auto i = threadData->children.begin(); i != threadData->children.end(); i++)
        {
            delete *i;
        }

        threadData->children.clear();
    }

    return true;
}